

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O1

void dg::pta::removeNode(PointerGraph *G,PSNode *nd)

{
  SubgraphNode<dg::pta::PSNode>::isolate(&nd->super_SubgraphNode<dg::pta::PSNode>);
  SubgraphNode<dg::pta::PSNode>::removeAllOperands(&nd->super_SubgraphNode<dg::pta::PSNode>);
  PointerGraph::remove(G,(char *)nd);
  return;
}

Assistant:

void removeNode(PointerGraph *G, PSNode *nd) {
    // llvm::errs() << "Remove node " << nd->getID() << "\n";

    assert(nd->getUsers().empty() && "Removing node that has users");
    // remove from CFG
    nd->isolate();
    // clear its operands (so that the operands do not
    // have a dangling reference to this node in 'users')
    nd->removeAllOperands();
    // delete it from the graph
    G->remove(nd);
}